

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool __thiscall
basist::basisu_lowlevel_etc1s_transcoder::transcode_image
          (basisu_lowlevel_etc1s_transcoder *this,transcoder_texture_format target_format,
          void *pOutput_blocks,uint32_t output_blocks_buf_size_in_blocks_or_pixels,
          uint8_t *pCompressed_data,uint32_t compressed_data_length,uint32_t num_blocks_x,
          uint32_t num_blocks_y,uint32_t orig_width,uint32_t orig_height,uint32_t level_index,
          uint32_t rgb_offset,uint32_t rgb_length,uint32_t alpha_offset,uint32_t alpha_length,
          uint32_t decode_flags,bool basis_file_has_alpha_slices,bool is_video,
          uint32_t output_row_pitch_in_blocks_or_pixels,basisu_transcoder_state *pState,
          uint32_t output_rows_in_pixels)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  byte bVar4;
  int in_ESI;
  uint in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000018;
  uint32_t in_stack_00000020;
  uint32_t in_stack_00000028;
  uint in_stack_00000030;
  uint in_stack_00000038;
  uint in_stack_00000040;
  uint in_stack_00000048;
  byte in_stack_00000058;
  vector<unsigned_int> temp_block_indices;
  bool is_alpha_slice;
  uint32_t data_len;
  uint8_t *pData;
  bool status;
  uint32_t total_slice_blocks;
  uint32_t bytes_per_block_or_pixel;
  bool transcode_alpha_data_to_opaque_formats;
  undefined1 in_stack_00000548;
  undefined1 in_stack_00000549;
  undefined1 in_stack_0000054a;
  undefined1 in_stack_0000054b;
  uint32_t in_stack_0000054c;
  uint8_t *in_stack_00000550;
  uint32_t in_stack_00000558;
  uint32_t in_stack_0000055c;
  void *in_stack_00000560;
  basisu_lowlevel_etc1s_transcoder *in_stack_00000568;
  block_format in_stack_00000590;
  uint32_t in_stack_00000598;
  uint32_t in_stack_000005b8;
  uint32_t in_stack_000005c0;
  uint32_t in_stack_000005c8;
  uint32_t in_stack_000005d0;
  basisu_transcoder_state *in_stack_000005d8;
  void *in_stack_000005e8;
  uint32_t in_stack_000005f0;
  undefined4 uVar5;
  uint32_t in_stack_fffffffffffffe4c;
  transcoder_texture_format in_stack_fffffffffffffe50;
  uint32_t uVar6;
  uint32_t in_stack_fffffffffffffe54;
  uint32_t in_stack_fffffffffffffe58;
  uint32_t in_stack_fffffffffffffe5c;
  transcoder_texture_format in_stack_fffffffffffffe60;
  uint32_t in_stack_fffffffffffffe6c;
  uint32_t in_stack_fffffffffffffe70;
  block_format in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  uint32_t in_stack_fffffffffffffe80;
  uint32_t in_stack_fffffffffffffe84;
  bool local_71;
  int local_44;
  bool local_31;
  
  bVar4 = in_stack_00000058 & 1;
  if ((ulong)in_R9D < (ulong)in_stack_00000030 + (ulong)in_stack_00000038) {
    local_31 = false;
  }
  else {
    if (in_stack_00000048 == 0) {
      if (((bVar4 ^ 0xff) & 1) == 0) {
        __assert_fail("!basis_file_has_alpha_slices",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x21e7,
                      "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                     );
      }
    }
    else if ((ulong)in_R9D < (ulong)in_stack_00000040 + (ulong)in_stack_00000048) {
      return false;
    }
    if (((in_ESI != 8) && (in_ESI != 9)) ||
       ((bVar1 = basisu::is_pow2(in_stack_00000008 << 2), bVar1 &&
        (bVar1 = basisu::is_pow2(in_stack_00000010 << 2), bVar1)))) {
      local_44 = in_ESI;
      if ((in_ESI == 9) && (bVar4 == 0)) {
        local_44 = 8;
      }
      uVar2 = basis_get_bytes_per_block_or_pixel(in_stack_fffffffffffffe50);
      iVar3 = in_stack_00000008 * in_stack_00000010;
      bVar1 = basis_validate_output_buffer_size
                        (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                         in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                         in_stack_fffffffffffffe70);
      if (bVar1) {
        switch(local_44) {
        case 0:
          local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                     in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                     in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                     (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                     in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                     in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                     in_stack_000005e8,in_stack_000005f0);
          break;
        case 1:
          if (uVar2 != 0x10) {
            __assert_fail("bytes_per_block_or_pixel == 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2291,
                          "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                         );
          }
          if (bVar4 == 0) {
            basisu_transcoder::write_opaque_alpha_blocks
                      (in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                       (void *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c
                      );
            local_71 = true;
          }
          else {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
          }
          if (local_71 != false) {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
          }
          break;
        case 2:
          local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                     in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                     in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                     (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                     in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                     in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                     in_stack_000005e8,in_stack_000005f0);
          break;
        case 3:
          if (uVar2 != 0x10) {
            __assert_fail("bytes_per_block_or_pixel == 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x22ba,
                          "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                         );
          }
          if (bVar4 == 0) {
            basisu_transcoder::write_opaque_alpha_blocks
                      (in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                       (void *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c
                      );
            local_71 = true;
          }
          else {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
          }
          if (local_71 != false) {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
          }
          break;
        case 4:
          local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                     in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                     in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                     (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                     in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                     in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                     in_stack_000005e8,in_stack_000005f0);
          break;
        case 5:
          if (uVar2 != 0x10) {
            __assert_fail("bytes_per_block_or_pixel == 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x22e0,
                          "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                         );
          }
          local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                     in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                     in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                     (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                     in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                     in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                     in_stack_000005e8,in_stack_000005f0);
          if (local_71) {
            if (bVar4 == 0) {
              basisu_transcoder::write_opaque_alpha_blocks
                        (in_stack_fffffffffffffe84,in_stack_00000020,
                         (void *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_00000018),
                         in_stack_fffffffffffffe74,in_stack_00000028,in_stack_fffffffffffffe6c);
              local_71 = true;
            }
            else {
              local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                         in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                         in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b
                                         ,(bool)in_stack_0000054a,(bool)in_stack_00000549,
                                         in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                         in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548
                                         ,in_stack_000005e8,in_stack_000005f0);
            }
          }
          break;
        case 6:
        case 7:
          if (uVar2 != 0x10) {
            __assert_fail("bytes_per_block_or_pixel == 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2275,
                          "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                         );
          }
          local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                     in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                     in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                     (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                     in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                     in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                     in_stack_000005e8,in_stack_000005f0);
          if ((local_71) && (bVar4 != 0)) {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
          }
          break;
        case 8:
          local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                     in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                     in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                     (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                     in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                     in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                     in_stack_000005e8,in_stack_000005f0);
          break;
        case 9:
          if (bVar4 == 0) {
            __assert_fail("basis_file_has_alpha_slices",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2253,
                          "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                         );
          }
          if (in_stack_00000048 == 0) {
            __assert_fail("alpha_length",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2254,
                          "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                         );
          }
          basisu::vector<unsigned_int>::vector
                    ((vector<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     CONCAT44(in_stack_fffffffffffffe4c,iVar3));
          basisu::vector<unsigned_int>::operator[]
                    ((vector<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     CONCAT44(in_stack_fffffffffffffe4c,iVar3));
          uVar6 = 4;
          uVar5 = 0x14;
          local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                     in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                     in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                     (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                     in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                     in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                     in_stack_000005e8,in_stack_000005f0);
          if (local_71) {
            basisu::vector<unsigned_int>::operator[]
                      ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffe54,uVar6),
                       CONCAT44(in_stack_fffffffffffffe4c,uVar5));
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
            uVar6 = uVar2;
          }
          basisu::vector<unsigned_int>::~vector
                    ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffe54,uVar6));
          break;
        case 10:
          if (uVar2 != 0x10) {
            __assert_fail("bytes_per_block_or_pixel == 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x2308,
                          "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                         );
          }
          if (bVar4 == 0) {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
          }
          else {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
            if (local_71) {
              local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                         in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                         in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b
                                         ,(bool)in_stack_0000054a,(bool)in_stack_00000549,
                                         in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                         in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548
                                         ,in_stack_000005e8,in_stack_000005f0);
            }
          }
          break;
        case 0xb:
          local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                     in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                     in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                     (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                     in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                     in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                     in_stack_000005e8,in_stack_000005f0);
          break;
        case 0xc:
          if (uVar2 != 0x10) {
            __assert_fail("bytes_per_block_or_pixel == 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x233b,
                          "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                         );
          }
          if (bVar4 == 0) {
            basisu_transcoder::write_opaque_alpha_blocks
                      (in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                       (void *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c
                      );
            local_71 = true;
          }
          else {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
          }
          if (local_71 != false) {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
          }
          break;
        case 0xd:
          if (bVar4 == 0) {
            local_71 = true;
          }
          else {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
          }
          if (local_71 != false) {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
          }
          break;
        case 0xe:
        case 0xf:
          local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                     in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                     in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                     (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                     in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                     in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                     in_stack_000005e8,in_stack_000005f0);
          break;
        case 0x10:
          if (bVar4 == 0) {
            local_71 = true;
          }
          else {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
          }
          if (local_71 != false) {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
          }
          break;
        case 0x11:
          return false;
        case 0x12:
          local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                     in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                     in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                     (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                     in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                     in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                     in_stack_000005e8,in_stack_000005f0);
          break;
        case 0x13:
          if (bVar4 == 0) {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
          }
          else {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
            if (local_71) {
              local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                         in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                         in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b
                                         ,(bool)in_stack_0000054a,(bool)in_stack_00000549,
                                         in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                         in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548
                                         ,in_stack_000005e8,in_stack_000005f0);
            }
          }
          break;
        case 0x14:
          local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                     in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                     in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                     (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                     in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                     in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                     in_stack_000005e8,in_stack_000005f0);
          break;
        case 0x15:
          if (uVar2 != 0x10) {
            __assert_fail("bytes_per_block_or_pixel == 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                          ,0x23f3,
                          "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                         );
          }
          if (bVar4 == 0) {
            basisu_transcoder::write_opaque_alpha_blocks
                      (in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                       (void *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c
                      );
            local_71 = true;
          }
          else {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
          }
          if (local_71 != false) {
            local_71 = transcode_slice(in_stack_00000568,in_stack_00000560,in_stack_0000055c,
                                       in_stack_00000558,in_stack_00000550,in_stack_0000054c,
                                       in_stack_00000590,in_stack_00000598,(bool)in_stack_0000054b,
                                       (bool)in_stack_0000054a,(bool)in_stack_00000549,
                                       in_stack_000005b8,in_stack_000005c0,in_stack_000005c8,
                                       in_stack_000005d0,in_stack_000005d8,(bool)in_stack_00000548,
                                       in_stack_000005e8,in_stack_000005f0);
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                        ,0x2415,
                        "bool basist::basisu_lowlevel_etc1s_transcoder::transcode_image(transcoder_texture_format, void *, uint32_t, const uint8_t *, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool, bool, uint32_t, basisu_transcoder_state *, uint32_t)"
                       );
        }
        local_31 = local_71;
      }
      else {
        local_31 = false;
      }
    }
    else {
      local_31 = false;
    }
  }
  return local_31;
}

Assistant:

bool basisu_lowlevel_etc1s_transcoder::transcode_image(
			transcoder_texture_format target_format,
			void* pOutput_blocks, uint32_t output_blocks_buf_size_in_blocks_or_pixels,
			const uint8_t* pCompressed_data, uint32_t compressed_data_length,
			uint32_t num_blocks_x, uint32_t num_blocks_y, uint32_t orig_width, uint32_t orig_height, uint32_t level_index,
			uint32_t rgb_offset, uint32_t rgb_length, uint32_t alpha_offset, uint32_t alpha_length,
			uint32_t decode_flags,
			bool basis_file_has_alpha_slices,
			bool is_video,
			uint32_t output_row_pitch_in_blocks_or_pixels,
			basisu_transcoder_state* pState,
			uint32_t output_rows_in_pixels)
	{
		if (((uint64_t)rgb_offset + rgb_length) > (uint64_t)compressed_data_length)
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: source data buffer too small (color)\n");
			return false;
		}

		if (alpha_length)
		{
			if (((uint64_t)alpha_offset + alpha_length) > (uint64_t)compressed_data_length)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: source data buffer too small (alpha)\n");
				return false;
			}
		}
		else
		{
			assert(!basis_file_has_alpha_slices);
		}

		if ((target_format == transcoder_texture_format::cTFPVRTC1_4_RGB) || (target_format == transcoder_texture_format::cTFPVRTC1_4_RGBA))
		{
			if ((!basisu::is_pow2(num_blocks_x * 4)) || (!basisu::is_pow2(num_blocks_y * 4)))
			{
				// PVRTC1 only supports power of 2 dimensions
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: PVRTC1 only supports power of 2 dimensions\n");
				return false;
			}
		}

		if ((target_format == transcoder_texture_format::cTFPVRTC1_4_RGBA) && (!basis_file_has_alpha_slices))
		{
			// Switch to PVRTC1 RGB if the input doesn't have alpha.
			target_format = transcoder_texture_format::cTFPVRTC1_4_RGB;
		}
				
		const bool transcode_alpha_data_to_opaque_formats = (decode_flags & cDecodeFlagsTranscodeAlphaDataToOpaqueFormats) != 0;
		const uint32_t bytes_per_block_or_pixel = basis_get_bytes_per_block_or_pixel(target_format);
		const uint32_t total_slice_blocks = num_blocks_x * num_blocks_y;

		if (!basis_validate_output_buffer_size(target_format, output_blocks_buf_size_in_blocks_or_pixels, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, output_rows_in_pixels, total_slice_blocks))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: output buffer size too small\n");
			return false;
		}

		bool status = false;

		const uint8_t* pData = pCompressed_data + rgb_offset;
		uint32_t data_len = rgb_length;
		bool is_alpha_slice = false;

		// If the caller wants us to transcode the mip level's alpha data, then use the next slice.
		if ((basis_file_has_alpha_slices) && (transcode_alpha_data_to_opaque_formats))
		{
			pData = pCompressed_data + alpha_offset;
			data_len = alpha_length;
			is_alpha_slice = true;
		}

		switch (target_format)
		{
		case transcoder_texture_format::cTFETC1_RGB:
		{
			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC1, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cETC1, bytes_per_block_or_pixel, false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
							
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ETC1 failed\n");
			}
			break;
		}
		case transcoder_texture_format::cTFBC1_RGB:
		{
#if !BASISD_SUPPORT_DXT1
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: BC1/DXT1 unsupported\n");
			return false;
#else
			// status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC1, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cBC1, bytes_per_block_or_pixel, true, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to BC1 failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFBC4_R:
		{
#if !BASISD_SUPPORT_DXT5A
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: BC4/DXT5A unsupported\n");
			return false;
#else
			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC4, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cBC4, bytes_per_block_or_pixel, false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to BC4 failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFPVRTC1_4_RGB:
		{
#if !BASISD_SUPPORT_PVRTC1
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: PVRTC1 4 unsupported\n");
			return false;
#else
			// output_row_pitch_in_blocks_or_pixels is actually ignored because we're transcoding to PVRTC1. (Print a dev warning if it's != 0?)
			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cPVRTC1_4_RGB, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cPVRTC1_4_RGB, bytes_per_block_or_pixel, false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to PVRTC1 4 RGB failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFPVRTC1_4_RGBA:
		{
#if !BASISD_SUPPORT_PVRTC1
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: PVRTC1 4 unsupported\n");
			return false;
#else
			assert(basis_file_has_alpha_slices);
			assert(alpha_length);

			// Temp buffer to hold alpha block endpoint/selector indices
			basisu::vector<uint32_t> temp_block_indices(total_slice_blocks);

			// First transcode alpha data to temp buffer
			//status = transcode_slice(pData, data_size, slice_index + 1, &temp_block_indices[0], total_slice_blocks, block_format::cIndices, sizeof(uint32_t), decode_flags, pSlice_descs[slice_index].m_num_blocks_x, pState);
			status = transcode_slice(&temp_block_indices[0], num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cIndices, sizeof(uint32_t), false, is_video, true, level_index, orig_width, orig_height, num_blocks_x, pState, false, nullptr, 0);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to PVRTC1 4 RGBA failed (0)\n");
			}
			else
			{
				// output_row_pitch_in_blocks_or_pixels is actually ignored because we're transcoding to PVRTC1. (Print a dev warning if it's != 0?)
				//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cPVRTC1_4_RGBA, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState, &temp_block_indices[0]);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cPVRTC1_4_RGBA, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, &temp_block_indices[0], 0);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to PVRTC1 4 RGBA failed (1)\n");
				}
			}

			break;
#endif
		}
		case transcoder_texture_format::cTFBC7_RGBA:
		case transcoder_texture_format::cTFBC7_ALT:
		{
#if !BASISD_SUPPORT_BC7_MODE5
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: BC7 unsupported\n");
			return false;
#else
			assert(bytes_per_block_or_pixel == 16);
			// We used to support transcoding just alpha to BC7 - but is that useful at all?

			// First transcode the color slice. The cBC7_M5_COLOR transcoder will output opaque mode 5 blocks.
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC7_M5_COLOR, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cBC7_M5_COLOR, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);

			if ((status) && (basis_file_has_alpha_slices))
			{
				// Now transcode the alpha slice. The cBC7_M5_ALPHA transcoder will now change the opaque mode 5 blocks to blocks with alpha.
				//status = transcode_slice(pData, data_size, slice_index + 1, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC7_M5_ALPHA, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cBC7_M5_ALPHA, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			}

			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to BC7 failed (0)\n");
			}

			break;
#endif
		}
		case transcoder_texture_format::cTFETC2_RGBA:
		{
#if !BASISD_SUPPORT_ETC2_EAC_A8
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: ETC2 EAC A8 unsupported\n");
			return false;
#else
			assert(bytes_per_block_or_pixel == 16);

			if (basis_file_has_alpha_slices)
			{
				// First decode the alpha data 
				//status = transcode_slice(pData, data_size, slice_index + 1, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC2_EAC_A8, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cETC2_EAC_A8, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			}
			else
			{
				//write_opaque_alpha_blocks(pSlice_descs[slice_index].m_num_blocks_x, pSlice_descs[slice_index].m_num_blocks_y, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC2_EAC_A8, 16, output_row_pitch_in_blocks_or_pixels);
				basisu_transcoder::write_opaque_alpha_blocks(num_blocks_x, num_blocks_y, pOutput_blocks, block_format::cETC2_EAC_A8, 16, output_row_pitch_in_blocks_or_pixels);
				status = true;
			}

			if (status)
			{
				// Now decode the color data
				//status = transcode_slice(pData, data_size, slice_index, (uint8_t*)pOutput_blocks + 8, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC1, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice((uint8_t *)pOutput_blocks + 8, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cETC1, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ETC2 RGB failed\n");
				}
			}
			else
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ETC2 A failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFBC3_RGBA:
		{
#if !BASISD_SUPPORT_DXT1
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: DXT1 unsupported\n");
			return false;
#elif !BASISD_SUPPORT_DXT5A
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: DXT5A unsupported\n");
			return false;
#else
			assert(bytes_per_block_or_pixel == 16);
						
			// First decode the alpha data 
			if (basis_file_has_alpha_slices)
			{
				//status = transcode_slice(pData, data_size, slice_index + 1, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC4, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cBC4, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			}
			else
			{
				basisu_transcoder::write_opaque_alpha_blocks(num_blocks_x, num_blocks_y, pOutput_blocks, block_format::cBC4, 16, output_row_pitch_in_blocks_or_pixels);
				status = true;
			}

			if (status)
			{
				// Now decode the color data. Forbid 3 color blocks, which aren't allowed in BC3.
				//status = transcode_slice(pData, data_size, slice_index, (uint8_t*)pOutput_blocks + 8, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC1, 16, decode_flags | cDecodeFlagsBC1ForbidThreeColorBlocks, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice((uint8_t *)pOutput_blocks + 8, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cBC1, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to BC3 RGB failed\n");
				}
			}
			else
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to BC3 A failed\n");
			}

			break;
#endif
		}
		case transcoder_texture_format::cTFBC5_RG:
		{
#if !BASISD_SUPPORT_DXT5A
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: DXT5A unsupported\n");
			return false;
#else
			assert(bytes_per_block_or_pixel == 16);

			//bool transcode_slice(void* pDst_blocks, uint32_t num_blocks_x, uint32_t num_blocks_y, const uint8_t* pImage_data, uint32_t image_data_size, block_format fmt,
				//	uint32_t output_block_or_pixel_stride_in_bytes, bool bc1_allow_threecolor_blocks, const bool is_video, const bool is_alpha_slice, const uint32_t level_index, const uint32_t orig_width, const uint32_t orig_height, uint32_t output_row_pitch_in_blocks_or_pixels = 0,
				//	basisu_transcoder_state* pState = nullptr, bool astc_transcode_alpha = false, void* pAlpha_blocks = nullptr, uint32_t output_rows_in_pixels = 0);

			// Decode the R data (actually the green channel of the color data slice in the basis file)
			//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC4, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cBC4, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (status)
			{
				if (basis_file_has_alpha_slices)
				{
					// Decode the G data (actually the green channel of the alpha data slice in the basis file)
					//status = transcode_slice(pData, data_size, slice_index + 1, (uint8_t*)pOutput_blocks + 8, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC4, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
					status = transcode_slice((uint8_t *)pOutput_blocks + 8, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cBC4, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
					if (!status)
					{
						BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to BC5 1 failed\n");
					}
				}
				else
				{
					basisu_transcoder::write_opaque_alpha_blocks(num_blocks_x, num_blocks_y, (uint8_t*)pOutput_blocks + 8, block_format::cBC4, 16, output_row_pitch_in_blocks_or_pixels);
					status = true;
				}
			}
			else
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to BC5 channel 0 failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFASTC_4x4_RGBA:
		{
#if !BASISD_SUPPORT_ASTC
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: ASTC unsupported\n");
			return false;
#else
			assert(bytes_per_block_or_pixel == 16);

			if (basis_file_has_alpha_slices)
			{
				// First decode the alpha data to the output (we're using the output texture as a temp buffer here).
				//status = transcode_slice(pData, data_size, slice_index + 1, (uint8_t*)pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cIndices, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cIndices, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (status)
				{
					// Now decode the color data and transcode to ASTC. The transcoder function will read the alpha selector data from the output texture as it converts and
					// transcode both the alpha and color data at the same time to ASTC.
					//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cASTC_4x4, 16, decode_flags | cDecodeFlagsOutputHasAlphaIndices, output_row_pitch_in_blocks_or_pixels, pState);
					status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cASTC_4x4, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, true, nullptr, output_rows_in_pixels);
				}
			}
			else
				//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cASTC_4x4, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cASTC_4x4, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);

			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ASTC failed (0)\n");
			}

			break;
#endif
		}
		case transcoder_texture_format::cTFATC_RGB:
		{
#if !BASISD_SUPPORT_ATC
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: ATC unsupported\n");
			return false;
#else
			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cATC_RGB, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cATC_RGB, bytes_per_block_or_pixel, false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ATC_RGB failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFATC_RGBA:
		{
#if !BASISD_SUPPORT_ATC
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: ATC unsupported\n");
			return false;
#elif !BASISD_SUPPORT_DXT5A
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: DXT5A unsupported\n");
			return false;
#else
			assert(bytes_per_block_or_pixel == 16);

			// First decode the alpha data 
			if (basis_file_has_alpha_slices)
			{
				//status = transcode_slice(pData, data_size, slice_index + 1, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cBC4, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cBC4, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			}
			else
			{
				basisu_transcoder::write_opaque_alpha_blocks(num_blocks_x, num_blocks_y, pOutput_blocks, block_format::cBC4, 16, output_row_pitch_in_blocks_or_pixels);
				status = true;
			}

			if (status)
			{
				//status = transcode_slice(pData, data_size, slice_index, (uint8_t*)pOutput_blocks + 8, output_blocks_buf_size_in_blocks_or_pixels, block_format::cATC_RGB, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice((uint8_t *)pOutput_blocks + 8, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cATC_RGB, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ATC RGB failed\n");
				}
			}
			else
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ATC A failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFPVRTC2_4_RGB:
		{
#if !BASISD_SUPPORT_PVRTC2
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: PVRTC2 unsupported\n");
			return false;
#else
			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cPVRTC2_4_RGB, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cPVRTC2_4_RGB, bytes_per_block_or_pixel, false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to cPVRTC2_4_RGB failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFPVRTC2_4_RGBA:
		{
#if !BASISD_SUPPORT_PVRTC2
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: PVRTC2 unsupported\n");
			return false;
#else
			if (basis_file_has_alpha_slices)
			{
				// First decode the alpha data to the output (we're using the output texture as a temp buffer here).
				//status = transcode_slice(pData, data_size, slice_index + 1, (uint8_t*)pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cIndices, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cIndices, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to failed\n");
				}
				else
				{
					// Now decode the color data and transcode to PVRTC2 RGBA. 
					//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cPVRTC2_4_RGBA, bytes_per_block_or_pixel, decode_flags | cDecodeFlagsOutputHasAlphaIndices, output_row_pitch_in_blocks_or_pixels, pState);
					status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cPVRTC2_4_RGBA, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, true, nullptr, output_rows_in_pixels);
				}
			}
			else
				//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cPVRTC2_4_RGB, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cPVRTC2_4_RGB, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);

			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to cPVRTC2_4_RGBA failed\n");
			}

			break;
#endif
		}
		case transcoder_texture_format::cTFRGBA32:
		{
			// Raw 32bpp pixels, decoded in the usual raster order (NOT block order) into an image in memory.

			// First decode the alpha data 
			if (basis_file_has_alpha_slices)
				//status = transcode_slice(pData, data_size, slice_index + 1, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cA32, sizeof(uint32_t), decode_flags, output_row_pitch_in_blocks_or_pixels, pState, nullptr, output_rows_in_pixels);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cA32, sizeof(uint32_t), false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			else
				status = true;

			if (status)
			{
				//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, basis_file_has_alpha_slices ? block_format::cRGB32 : block_format::cRGBA32, sizeof(uint32_t), decode_flags, output_row_pitch_in_blocks_or_pixels, pState, nullptr, output_rows_in_pixels);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, basis_file_has_alpha_slices ? block_format::cRGB32 : block_format::cRGBA32, sizeof(uint32_t), false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to RGBA32 RGB failed\n");
				}
			}
			else
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to RGBA32 A failed\n");
			}

			break;
		}
		case transcoder_texture_format::cTFRGB565:
		case transcoder_texture_format::cTFBGR565:
		{
			// Raw 16bpp pixels, decoded in the usual raster order (NOT block order) into an image in memory.

			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, (fmt == transcoder_texture_format::cTFRGB565) ? block_format::cRGB565 : block_format::cBGR565, sizeof(uint16_t), decode_flags, output_row_pitch_in_blocks_or_pixels, pState, nullptr, output_rows_in_pixels);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, (target_format == transcoder_texture_format::cTFRGB565) ? block_format::cRGB565 : block_format::cBGR565, sizeof(uint16_t), false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to RGB565 RGB failed\n");
			}

			break;
		}
		case transcoder_texture_format::cTFRGBA4444:
		{
			// Raw 16bpp pixels, decoded in the usual raster order (NOT block order) into an image in memory.

			// First decode the alpha data 
			if (basis_file_has_alpha_slices)
				//status = transcode_slice(pData, data_size, slice_index + 1, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cRGBA4444_ALPHA, sizeof(uint16_t), decode_flags, output_row_pitch_in_blocks_or_pixels, pState, nullptr, output_rows_in_pixels);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cRGBA4444_ALPHA, sizeof(uint16_t), false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			else
				status = true;

			if (status)
			{
				//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, basis_file_has_alpha_slices ? block_format::cRGBA4444_COLOR : block_format::cRGBA4444_COLOR_OPAQUE, sizeof(uint16_t), decode_flags, output_row_pitch_in_blocks_or_pixels, pState, nullptr, output_rows_in_pixels);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, basis_file_has_alpha_slices ? block_format::cRGBA4444_COLOR : block_format::cRGBA4444_COLOR_OPAQUE, sizeof(uint16_t), false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to RGBA4444 RGB failed\n");
				}
			}
			else
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to RGBA4444 A failed\n");
			}

			break;
		}
		case transcoder_texture_format::cTFFXT1_RGB:
		{
#if !BASISD_SUPPORT_FXT1
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: FXT1 unsupported\n");
			return false;
#else
			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cFXT1_RGB, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cFXT1_RGB, bytes_per_block_or_pixel, false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to FXT1_RGB failed\n");
			}
			break;
#endif
		}
		case transcoder_texture_format::cTFETC2_EAC_R11:
		{
#if !BASISD_SUPPORT_ETC2_EAC_RG11
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: EAC_RG11 unsupported\n");
			return false;
#else
			//status = transcode_slice(pData, data_size, slice_index_to_decode, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC2_EAC_R11, bytes_per_block_or_pixel, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
			status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pData, data_len, block_format::cETC2_EAC_R11, bytes_per_block_or_pixel, false, is_video, is_alpha_slice, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			if (!status)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ETC2_EAC_R11 failed\n");
			}

			break;
#endif
		}
		case transcoder_texture_format::cTFETC2_EAC_RG11:
		{
#if !BASISD_SUPPORT_ETC2_EAC_RG11
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: EAC_RG11 unsupported\n");
			return false;
#else
			assert(bytes_per_block_or_pixel == 16);

			if (basis_file_has_alpha_slices)
			{
				// First decode the alpha data to G
				//status = transcode_slice(pData, data_size, slice_index + 1, (uint8_t*)pOutput_blocks + 8, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC2_EAC_R11, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice((uint8_t *)pOutput_blocks + 8, num_blocks_x, num_blocks_y, pCompressed_data + alpha_offset, alpha_length, block_format::cETC2_EAC_R11, bytes_per_block_or_pixel, false, is_video, true, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
			}
			else
			{
				basisu_transcoder::write_opaque_alpha_blocks(num_blocks_x, num_blocks_y, (uint8_t*)pOutput_blocks + 8, block_format::cETC2_EAC_R11, 16, output_row_pitch_in_blocks_or_pixels);
				status = true;
			}

			if (status)
			{
				// Now decode the color data to R
				//status = transcode_slice(pData, data_size, slice_index, pOutput_blocks, output_blocks_buf_size_in_blocks_or_pixels, block_format::cETC2_EAC_R11, 16, decode_flags, output_row_pitch_in_blocks_or_pixels, pState);
				status = transcode_slice(pOutput_blocks, num_blocks_x, num_blocks_y, pCompressed_data + rgb_offset, rgb_length, block_format::cETC2_EAC_R11, bytes_per_block_or_pixel, false, is_video, false, level_index, orig_width, orig_height, output_row_pitch_in_blocks_or_pixels, pState, false, nullptr, output_rows_in_pixels);
				if (!status)
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ETC2_EAC_R11 R failed\n");
				}
			}
			else
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: transcode_slice() to ETC2_EAC_R11 G failed\n");
			}

			break;
#endif
		}
		default:
		{
			assert(0);
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::transcode_image: Invalid fmt\n");
			break;
		}
		}

		return status;
	}